

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  pointer piVar2;
  string *psVar3;
  LogMessageFatal *pLVar4;
  LogMessageFatal aLStack_28 [16];
  
  pLVar4 = aLStack_28;
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x21f,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_28,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0013aa2a;
  }
  if (pEVar1->is_repeated == false) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      SetRepeatedEnum((ExtensionSet *)aLStack_28);
LAB_0013a9fe:
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar4,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      pLVar4 = (LogMessageFatal *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (pLVar4 != (LogMessageFatal *)0x8) goto LAB_0013a9fe;
      psVar3 = (string *)0x0;
    }
    if (psVar3 == (string *)0x0) {
      piVar2 = RepeatedField<int>::Mutable((RepeatedField<int> *)pEVar1->field_0,index);
      *piVar2 = value;
      return;
    }
  }
  else {
    SetRepeatedEnum();
  }
  SetRepeatedEnum();
LAB_0013aa2a:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->ptr.repeated_enum_value->Set(index, value);
}